

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

uint get_input_line(char **string,uint option)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *__s;
  ulong uVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  
  __s = vrna_read_line(_stdin);
  uVar8 = 1;
  if (__s != (char *)0x0) {
    if ((char)option < '\0') {
      cVar2 = *__s;
LAB_0012a233:
      if (cVar2 == '@') {
        free(__s);
        uVar8 = 2;
      }
      else {
        if ((option >> 8 & 1) == 0) {
          uVar4 = strlen(__s);
          if (0 < (int)(uint)uVar4) {
            uVar4 = (ulong)((uint)uVar4 & 0x7fffffff);
            do {
              if ((__s[uVar4 - 1] != ' ') && (__s[uVar4 - 1] != '\t')) goto LAB_0012a280;
              bVar1 = 1 < uVar4;
              uVar4 = uVar4 - 1;
            } while (bVar1);
            uVar4 = 0;
          }
LAB_0012a280:
          uVar7 = 0;
          if (0 < (int)uVar4) {
            uVar7 = uVar4 & 0xffffffff;
          }
          __s[uVar7] = '\0';
          cVar2 = *__s;
        }
        if (cVar2 == '>') {
          sVar5 = strlen(__s);
          pcVar6 = (char *)vrna_alloc((int)sVar5 + 1);
          *string = pcVar6;
          iVar3 = __isoc99_sscanf(__s,">%s",pcVar6);
          if (iVar3 < 1) {
            free(__s);
            free(*string);
            *string = (char *)0x0;
          }
          else {
            pcVar6 = *string;
            sVar5 = strlen(pcVar6);
            pcVar6 = (char *)vrna_realloc(pcVar6,(int)sVar5 + 1);
            *string = pcVar6;
            free(__s);
            uVar8 = 8;
          }
        }
        else {
          pcVar6 = strdup(__s);
          *string = pcVar6;
          free(__s);
          uVar8 = 4;
        }
      }
    }
    else {
      do {
        cVar2 = *__s;
        if ((cVar2 != '*') && (cVar2 != '\0')) goto LAB_0012a233;
        free(__s);
        __s = vrna_read_line(_stdin);
      } while (__s != (char *)0x0);
    }
  }
  return uVar8;
}

Assistant:

PUBLIC unsigned int
get_input_line(char         **string,
               unsigned int option)
{
  char  *line;
  int   i, l, r;

  /*
   * read lines until informative data appears or
   * report an error if anything goes wrong
   */
  if ((line = vrna_read_line(stdin)) == NULL)
    return VRNA_INPUT_ERROR;

  if (!(option & VRNA_INPUT_NOSKIP_COMMENTS)) {
    while ((*line == '*') || (*line == '\0')) {
      free(line);
      if ((line = vrna_read_line(stdin)) == NULL)
        return VRNA_INPUT_ERROR;
    }
  }

  l = (int)strlen(line);

  /* break on '@' sign if not disabled */
  if (*line == '@') {
    free(line);
    return VRNA_INPUT_QUIT;
  }

  /* print line read if not disabled */
  /* if(!(option & VRNA_INPUT_NOPRINT)) printf("%s\n", line); */

  /* eliminate whitespaces at the end of the line read */
  if (!(option & VRNA_INPUT_NO_TRUNCATION)) {
    for (i = l - 1; i >= 0; i--) {
      if (line[i] == ' ')
        continue;
      else if (line[i] == '\t')
        continue;
      else
        break;
    }
    line[(i >= 0) ? (i + 1) : 0] = '\0';
  }

  if (*line == '>') {
    /* fasta header */
    /* alloc memory for the string */
    *string = (char *)vrna_alloc(sizeof(char) * (strlen(line) + 1));
    r       = VRNA_INPUT_FASTA_HEADER;
    i       = sscanf(line, ">%s", *string);
    if (i > 0) {
      i       = (int)strlen(*string);
      *string = (char *)vrna_realloc(*string, (i + 1) * sizeof(char));
      free(line);
      return r;
    } else {
      free(line);
      free(*string);
      *string = NULL;
      return VRNA_INPUT_ERROR;
    }
  } else {
    *string = strdup(line);
    free(line);
  }

  return VRNA_INPUT_MISC;
}